

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::OneofDescriptor::DebugString
          (OneofDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  ushort *puVar1;
  FeatureSet *from;
  FeatureSet *this_00;
  FieldDescriptor *this_01;
  int i;
  int index;
  string_view format;
  string_view format_00;
  string prefix;
  OneofOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  Arg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  full_options.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)prefix._M_string_length;
  full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)prefix._M_dataplus._M_p;
  puVar1 = (ushort *)(this->all_names_).payload_;
  local_60.piece_._M_len = (size_t)*puVar1;
  local_60.piece_._M_str = (char *)((long)puVar1 + ~local_60.piece_._M_len);
  format._M_str = "$0oneof $1 {";
  format._M_len = 0xc;
  absl::lts_20250127::SubstituteAndAppend(contents,format,(Arg *)&full_options,&local_60);
  OneofOptions::OneofOptions(&full_options,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    this_00 = OneofOptions::mutable_features(&full_options);
    FeatureSet::CopyFrom(this_00,from);
  }
  anon_unknown_24::FormatLineOptions
            (depth + 1,&full_options.super_Message,this->containing_type_->file_->pool_,contents);
  if (debug_string_options->elide_oneof_body == true) {
    std::__cxx11::string::append((char *)contents);
  }
  else {
    std::__cxx11::string::append((char *)contents);
    for (index = 0; index < this->field_count_; index = index + 1) {
      this_01 = field(this,index);
      FieldDescriptor::DebugString(this_01,depth + 1,contents,debug_string_options);
    }
    local_60.piece_._M_len = prefix._M_string_length;
    local_60.piece_._M_str = prefix._M_dataplus._M_p;
    format_00._M_str = "$0}\n";
    format_00._M_len = 4;
    absl::lts_20250127::SubstituteAndAppend(contents,format_00,&local_60);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  OneofOptions::~OneofOptions(&full_options);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void OneofDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;
  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);
  absl::SubstituteAndAppend(contents, "$0oneof $1 {", prefix, name());

  OneofOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, containing_type()->file()->pool(),
                    contents);

  if (debug_string_options.elide_oneof_body) {
    contents->append(" ... }\n");
  } else {
    contents->append("\n");
    for (int i = 0; i < field_count(); i++) {
      field(i)->DebugString(depth, contents, debug_string_options);
    }
    absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  }
  comment_printer.AddPostComment(contents);
}